

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsLineItem::setLine(QGraphicsLineItem *this,QLineF *line)

{
  QGraphicsItemPrivate *pQVar1;
  _func_int **pp_Var2;
  Data *pDVar3;
  qreal qVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QRectF local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsItem).d_ptr.d;
  bVar5 = ::comparesEqual((QLineF *)(pQVar1 + 1),line);
  if (!bVar5) {
    QGraphicsItem::prepareGeometryChange(&this->super_QGraphicsItem);
    pp_Var2 = (_func_int **)(line->pt1).xp;
    pDVar3 = (Data *)(line->pt1).yp;
    qVar4 = (line->pt2).yp;
    pQVar1[1].extras.d.ptr = (ExtraStruct *)(line->pt2).xp;
    pQVar1[1].extras.d.size = (qsizetype)qVar4;
    pQVar1[1]._vptr_QGraphicsItemPrivate = pp_Var2;
    pQVar1[1].extras.d.d = pDVar3;
    local_48.w = 0.0;
    local_48.h = 0.0;
    local_48.xp = 0.0;
    local_48.yp = 0.0;
    QGraphicsItem::update(&this->super_QGraphicsItem,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsLineItem::setLine(const QLineF &line)
{
    Q_D(QGraphicsLineItem);
    if (d->line == line)
        return;
    prepareGeometryChange();
    d->line = line;
    update();
}